

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambdaref_expression.cpp
# Opt level: O3

string * __thiscall
duckdb::BoundLambdaRefExpression::ToString_abi_cxx11_
          (string *__return_storage_ptr__,BoundLambdaRefExpression *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  size_type *psVar13;
  char cVar14;
  string __str_2;
  string __str_1;
  string __str;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  ulong *local_d0;
  uint local_c8;
  undefined4 uStack_c4;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  sVar2 = (this->super_Expression).super_BaseExpression.alias._M_string_length;
  if (sVar2 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (this->super_Expression).super_BaseExpression.alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
    return __return_storage_ptr__;
  }
  uVar4 = (this->binding).table_index;
  cVar14 = '\x01';
  if (9 < uVar4) {
    uVar12 = uVar4;
    cVar7 = '\x04';
    do {
      cVar14 = cVar7;
      if (uVar12 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0118b29d;
      }
      if (uVar12 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0118b29d;
      }
      if (uVar12 < 10000) goto LAB_0118b29d;
      bVar5 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar7 = cVar14 + '\x04';
    } while (bVar5);
    cVar14 = cVar14 + '\x01';
  }
LAB_0118b29d:
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,uVar4);
  plVar8 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1de212a);
  local_70 = &local_60;
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar8[3];
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_70);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_a0 = *puVar11;
    lStack_98 = plVar8[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar11;
    local_b0 = (ulong *)*plVar8;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar4 = (this->binding).column_index;
  cVar14 = '\x01';
  if (9 < uVar4) {
    uVar12 = uVar4;
    cVar7 = '\x04';
    do {
      cVar14 = cVar7;
      if (uVar12 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0118b3f9;
      }
      if (uVar12 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0118b3f9;
      }
      if (uVar12 < 10000) goto LAB_0118b3f9;
      bVar5 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar7 = cVar14 + '\x04';
    } while (bVar5);
    cVar14 = cVar14 + '\x01';
  }
LAB_0118b3f9:
  local_d0 = local_c0;
  ::std::__cxx11::string::_M_construct((ulong)&local_d0,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_d0,local_c8,uVar4);
  uVar4 = CONCAT44(uStack_c4,local_c8) + local_a8;
  uVar12 = 0xf;
  if (local_b0 != &local_a0) {
    uVar12 = local_a0;
  }
  if (uVar12 < uVar4) {
    uVar12 = 0xf;
    if (local_d0 != local_c0) {
      uVar12 = local_c0[0];
    }
    if (uVar12 < uVar4) goto LAB_0118b46a;
    puVar9 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
  }
  else {
LAB_0118b46a:
    puVar9 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
  }
  local_130 = &local_120;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar9[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (undefined8 *)*puVar9;
  }
  local_128 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_130);
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_80 = *puVar11;
    lStack_78 = plVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar11;
    local_90 = (ulong *)*plVar8;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar4 = this->lambda_idx;
  cVar14 = '\x01';
  if (9 < uVar4) {
    uVar12 = uVar4;
    cVar7 = '\x04';
    do {
      cVar14 = cVar7;
      if (uVar12 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0118b58f;
      }
      if (uVar12 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0118b58f;
      }
      if (uVar12 < 10000) goto LAB_0118b58f;
      bVar5 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar7 = cVar14 + '\x04';
    } while (bVar5);
    cVar14 = cVar14 + '\x01';
  }
LAB_0118b58f:
  local_f0 = local_e0;
  ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar14);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,local_e8,uVar4);
  uVar4 = CONCAT44(uStack_e4,local_e8) + local_88;
  uVar12 = 0xf;
  if (local_90 != &local_80) {
    uVar12 = local_80;
  }
  if (uVar12 < uVar4) {
    uVar12 = 0xf;
    if (local_f0 != local_e0) {
      uVar12 = local_e0[0];
    }
    if (uVar4 <= uVar12) {
      puVar9 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
      goto LAB_0118b61e;
    }
  }
  puVar9 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f0);
LAB_0118b61e:
  local_110 = &local_100;
  puVar1 = puVar9 + 2;
  if ((undefined8 *)*puVar9 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar9[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar9;
  }
  local_108 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_110);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar13 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar13) {
    lVar6 = plVar8[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar13;
  }
  __return_storage_ptr__->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string BoundLambdaRefExpression::ToString() const {
	if (!alias.empty()) {
		return alias;
	}
	return "#[" + to_string(binding.table_index) + "." + to_string(binding.column_index) + "." + to_string(lambda_idx) +
	       "]";
}